

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

int __thiscall miniros::Subscription::shutdown(Subscription *this,int __fd,int __how)

{
  int extraout_EAX;
  
  std::mutex::lock(&this->shutdown_mutex_);
  this->shutting_down_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  drop(this);
  return extraout_EAX;
}

Assistant:

void Subscription::shutdown()
{
  {
    std::scoped_lock<std::mutex> lock(shutdown_mutex_);
    shutting_down_ = true;
  }

  drop();
}